

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

void __thiscall
testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
          (HasNewFatalFailureHelper *this)

{
  long lVar1;
  UnitTestImpl *pUVar2;
  TestPartResultReporterInterface *pTVar3;
  long in_FS_OFFSET;
  HasNewFatalFailureHelper *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TestPartResultReporterInterface::TestPartResultReporterInterface
            (&this->super_TestPartResultReporterInterface);
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__HasNewFatalFailureHelper_00214448;
  this->has_new_fatal_failure_ = false;
  pUVar2 = GetUnitTestImpl();
  pTVar3 = UnitTestImpl::GetTestPartResultReporterForCurrentThread(pUVar2);
  this->original_reporter_ = pTVar3;
  pUVar2 = GetUnitTestImpl();
  UnitTestImpl::SetTestPartResultReporterForCurrentThread
            (pUVar2,&this->super_TestPartResultReporterInterface);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

HasNewFatalFailureHelper::HasNewFatalFailureHelper()
    : has_new_fatal_failure_(false),
      original_reporter_(GetUnitTestImpl()->
                         GetTestPartResultReporterForCurrentThread()) {
  GetUnitTestImpl()->SetTestPartResultReporterForCurrentThread(this);
}